

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O3

void lowbd_fwd_txfm2d_64x32_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  byte bVar2;
  transform_1d_avx2_conflict1 p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int8_t *piVar7;
  bool bVar8;
  int16_t *piVar9;
  uint uVar10;
  undefined7 in_register_00000009;
  long lVar11;
  long lVar12;
  int iVar13;
  bool bVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  __m256i buf0 [64];
  __m256i bufB [64];
  __m256i bufA [64];
  __m256i buf1 [256];
  longlong local_3860 [256];
  longlong local_3060 [256];
  longlong local_2860 [256];
  longlong alStack_2060 [2];
  undefined1 local_2050 [2032];
  longlong alStack_1860 [774];
  
  piVar7 = av1_fwd_txfm_shift_ls[0xc];
  p_Var3 = col_txfm16x32_arr[CONCAT71(in_register_00000009,tx_type) & 0xffffffff];
  lVar12 = 0;
  do {
    lVar11 = 0;
    piVar9 = input;
    do {
      uVar4 = *(undefined8 *)(piVar9 + 4);
      uVar5 = *(undefined8 *)(piVar9 + 8);
      uVar6 = *(undefined8 *)(piVar9 + 0xc);
      *(undefined8 *)((long)local_3860 + lVar11) = *(undefined8 *)piVar9;
      *(undefined8 *)((long)local_3860 + lVar11 + 8) = uVar4;
      *(undefined8 *)((long)local_3860 + lVar11 + 0x10) = uVar5;
      *(undefined8 *)((long)local_3860 + lVar11 + 0x18) = uVar6;
      lVar11 = lVar11 + 0x20;
      piVar9 = piVar9 + stride;
    } while (lVar11 != 0x400);
    bVar2 = *piVar7;
    uVar10 = (uint)(char)bVar2;
    if ((int)uVar10 < 0) {
      auVar17._0_2_ = (undefined2)(1 << (~bVar2 & 0x1f));
      auVar17._2_2_ = auVar17._0_2_;
      auVar17._4_2_ = auVar17._0_2_;
      auVar17._6_2_ = auVar17._0_2_;
      auVar17._8_2_ = auVar17._0_2_;
      auVar17._10_2_ = auVar17._0_2_;
      auVar17._12_2_ = auVar17._0_2_;
      auVar17._14_2_ = auVar17._0_2_;
      auVar17._16_2_ = auVar17._0_2_;
      auVar17._18_2_ = auVar17._0_2_;
      auVar17._20_2_ = auVar17._0_2_;
      auVar17._22_2_ = auVar17._0_2_;
      auVar17._24_2_ = auVar17._0_2_;
      auVar17._26_2_ = auVar17._0_2_;
      auVar17._28_2_ = auVar17._0_2_;
      auVar17._30_2_ = auVar17._0_2_;
      lVar11 = 0;
      do {
        auVar15 = vpaddsw_avx2(auVar17,*(undefined1 (*) [32])((long)local_3860 + lVar11));
        auVar15 = vpsraw_avx2(auVar15,ZEXT416(-uVar10));
        *(undefined1 (*) [32])((long)local_3860 + lVar11) = auVar15;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar11 = 0;
      do {
        auVar17 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_3860 + lVar11),ZEXT416(uVar10));
        *(undefined1 (*) [32])((long)local_3860 + lVar11) = auVar17;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x400);
    }
    (*p_Var3)((__m256i *)local_3860,(__m256i *)local_3860,'\f');
    bVar2 = piVar7[1];
    uVar10 = (uint)(char)bVar2;
    if ((int)uVar10 < 0) {
      auVar15._0_2_ = (undefined2)(1 << (~bVar2 & 0x1f));
      auVar15._2_2_ = auVar15._0_2_;
      auVar15._4_2_ = auVar15._0_2_;
      auVar15._6_2_ = auVar15._0_2_;
      auVar15._8_2_ = auVar15._0_2_;
      auVar15._10_2_ = auVar15._0_2_;
      auVar15._12_2_ = auVar15._0_2_;
      auVar15._14_2_ = auVar15._0_2_;
      auVar15._16_2_ = auVar15._0_2_;
      auVar15._18_2_ = auVar15._0_2_;
      auVar15._20_2_ = auVar15._0_2_;
      auVar15._22_2_ = auVar15._0_2_;
      auVar15._24_2_ = auVar15._0_2_;
      auVar15._26_2_ = auVar15._0_2_;
      auVar15._28_2_ = auVar15._0_2_;
      auVar15._30_2_ = auVar15._0_2_;
      lVar11 = 0;
      do {
        auVar17 = vpaddsw_avx2(auVar15,*(undefined1 (*) [32])((long)local_3860 + lVar11));
        auVar17 = vpsraw_avx2(auVar17,ZEXT416(-uVar10));
        *(undefined1 (*) [32])((long)local_3860 + lVar11) = auVar17;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar11 = 0;
      do {
        auVar17 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_3860 + lVar11),ZEXT416(uVar10));
        *(undefined1 (*) [32])((long)local_3860 + lVar11) = auVar17;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x400);
    }
    transpose_16bit_16x16_avx2((__m256i *)local_3860,(__m256i *)(alStack_2060 + lVar12 * 0x40));
    transpose_16bit_16x16_avx2
              ((__m256i *)(local_3860 + 0x40),(__m256i *)(alStack_1860 + lVar12 * 0x40));
    lVar12 = lVar12 + 1;
    input = input + 0x10;
  } while (lVar12 != 4);
  lVar12 = 0;
  bVar8 = true;
  do {
    bVar14 = bVar8;
    lVar11 = 0;
    do {
      auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)alStack_2060 + lVar11 + lVar12 * 0x800))
      ;
      auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_2050 + lVar11 + lVar12 * 0x800));
      *(undefined1 (*) [32])((long)local_2860 + lVar11) = auVar17;
      *(undefined1 (*) [32])((long)local_3060 + lVar11) = auVar15;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x800);
    fdct64_new_avx2((__m256i *)local_2860,(__m256i *)local_2860,'\v');
    fdct64_new_avx2((__m256i *)local_3060,(__m256i *)local_3060,'\v');
    bVar2 = piVar7[2];
    uVar10 = (uint)(char)bVar2;
    if ((int)uVar10 < 0) {
      iVar13 = 1 << (~bVar2 & 0x1f);
      auVar18._4_4_ = iVar13;
      auVar18._0_4_ = iVar13;
      auVar18._8_4_ = iVar13;
      auVar18._12_4_ = iVar13;
      auVar18._16_4_ = iVar13;
      auVar18._20_4_ = iVar13;
      auVar18._24_4_ = iVar13;
      auVar18._28_4_ = iVar13;
      lVar11 = 0;
      auVar19._8_4_ = 0x16a1;
      auVar19._0_8_ = 0x16a1000016a1;
      auVar19._12_4_ = 0x16a1;
      auVar19._16_4_ = 0x16a1;
      auVar19._20_4_ = 0x16a1;
      auVar19._24_4_ = 0x16a1;
      auVar19._28_4_ = 0x16a1;
      auVar20._8_4_ = 0x800;
      auVar20._0_8_ = 0x80000000800;
      auVar20._12_4_ = 0x800;
      auVar20._16_4_ = 0x800;
      auVar20._20_4_ = 0x800;
      auVar20._24_4_ = 0x800;
      auVar20._28_4_ = 0x800;
      do {
        auVar17 = vpaddd_avx2(auVar18,*(undefined1 (*) [32])((long)local_2860 + lVar11));
        auVar17 = vpsrad_avx2(auVar17,ZEXT416(-uVar10));
        auVar17 = vpmulld_avx2(auVar17,auVar19);
        auVar17 = vpaddd_avx2(auVar17,auVar20);
        auVar17 = vpsrad_avx2(auVar17,0xc);
        *(undefined1 (*) [32])((long)local_2860 + lVar11) = auVar17;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x400);
    }
    else {
      lVar11 = 0;
      auVar19._8_4_ = 0x16a1;
      auVar19._0_8_ = 0x16a1000016a1;
      auVar19._12_4_ = 0x16a1;
      auVar19._16_4_ = 0x16a1;
      auVar19._20_4_ = 0x16a1;
      auVar19._24_4_ = 0x16a1;
      auVar19._28_4_ = 0x16a1;
      auVar20._8_4_ = 0x800;
      auVar20._0_8_ = 0x80000000800;
      auVar20._12_4_ = 0x800;
      auVar20._16_4_ = 0x800;
      auVar20._20_4_ = 0x800;
      auVar20._24_4_ = 0x800;
      auVar20._28_4_ = 0x800;
      do {
        auVar17 = vpslld_avx2(*(undefined1 (*) [32])((long)local_2860 + lVar11),ZEXT416(uVar10));
        auVar17 = vpmulld_avx2(auVar17,auVar19);
        auVar17 = vpaddd_avx2(auVar17,auVar20);
        auVar17 = vpsrad_avx2(auVar17,0xc);
        *(undefined1 (*) [32])((long)local_2860 + lVar11) = auVar17;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x400);
    }
    if ((char)bVar2 < '\0') {
      iVar13 = 1 << (~bVar2 & 0x1f);
      auVar16._4_4_ = iVar13;
      auVar16._0_4_ = iVar13;
      auVar16._8_4_ = iVar13;
      auVar16._12_4_ = iVar13;
      auVar16._16_4_ = iVar13;
      auVar16._20_4_ = iVar13;
      auVar16._24_4_ = iVar13;
      auVar16._28_4_ = iVar13;
      lVar11 = 0;
      do {
        auVar17 = vpaddd_avx2(auVar16,*(undefined1 (*) [32])((long)local_3060 + lVar11));
        auVar17 = vpsrad_avx2(auVar17,ZEXT416(-uVar10));
        auVar17 = vpmulld_avx2(auVar17,auVar19);
        auVar17 = vpaddd_avx2(auVar17,auVar20);
        auVar17 = vpsrad_avx2(auVar17,0xc);
        *(undefined1 (*) [32])((long)local_3060 + lVar11) = auVar17;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x400);
    }
    else {
      lVar11 = 0;
      do {
        auVar17 = vpslld_avx2(*(undefined1 (*) [32])((long)local_3060 + lVar11),ZEXT416(uVar10));
        auVar17 = vpmulld_avx2(auVar17,auVar19);
        auVar17 = vpaddd_avx2(auVar17,auVar20);
        auVar17 = vpsrad_avx2(auVar17,0xc);
        *(undefined1 (*) [32])((long)local_3060 + lVar11) = auVar17;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x400);
    }
    lVar11 = 0;
    do {
      uVar4 = *(undefined8 *)((long)local_2860 + lVar11 + 8);
      uVar5 = *(undefined8 *)((long)local_2860 + lVar11 + 0x10);
      uVar6 = *(undefined8 *)((long)local_2860 + lVar11 + 0x18);
      piVar1 = output + lVar12 * 0x10 + lVar11;
      *(undefined8 *)piVar1 = *(undefined8 *)((long)local_2860 + lVar11);
      *(undefined8 *)(piVar1 + 2) = uVar4;
      *(undefined8 *)(piVar1 + 4) = uVar5;
      *(undefined8 *)(piVar1 + 6) = uVar6;
      uVar4 = *(undefined8 *)((long)local_3060 + lVar11 + 8);
      uVar5 = *(undefined8 *)((long)local_3060 + lVar11 + 0x10);
      uVar6 = *(undefined8 *)((long)local_3060 + lVar11 + 0x18);
      piVar1 = output + lVar12 * 0x10 + lVar11 + 8;
      *(undefined8 *)piVar1 = *(undefined8 *)((long)local_3060 + lVar11);
      *(undefined8 *)(piVar1 + 2) = uVar4;
      *(undefined8 *)(piVar1 + 4) = uVar5;
      *(undefined8 *)(piVar1 + 6) = uVar6;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x400);
    lVar12 = 1;
    bVar8 = false;
  } while (bVar14);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x32_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  const TX_SIZE tx_size = TX_64X32;
  __m256i buf0[64], buf1[256];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = col_txfm16x32_arr[tx_type];
  const int width_div16 = (width >> 4);
  const int height_div16 = (height >> 4);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(4, height_div16); ++j) {
      transpose_16bit_16x16_avx2(buf0 + j * 16, buf1 + j * width + 16 * i);
    }
  }
  assert(tx_type == DCT_DCT);
  for (int i = 0; i < AOMMIN(2, height_div16); i++) {
    __m256i bufA[64];
    __m256i bufB[64];
    __m128i *buf = (__m128i *)(buf1 + width * i);
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm256_cvtepi16_epi32(buf[j * 2]);
      bufB[j] = _mm256_cvtepi16_epi32(buf[j * 2 + 1]);
    }
    fdct64_new_avx2(bufA, bufA, cos_bit_row);
    fdct64_new_avx2(bufB, bufB, cos_bit_row);
    round_shift_rect_array_32_avx2(bufA, bufA, 32, -shift[2], NewSqrt2);
    round_shift_rect_array_32_avx2(bufB, bufB, 32, -shift[2], NewSqrt2);

    store_output_32bit_w16(output + i * 16, bufA, bufB, 32, 32);
  }
}